

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall libtorrent::aux::torrent::stop_announcing(torrent *this)

{
  service_type *psVar1;
  byte bVar2;
  time_point32 now;
  
  bVar2 = this->field_0x5c0;
  if ((bVar2 & 0x40) == 0) {
    return;
  }
  if ((this->m_tracker_timer).impl_.implementation_.might_have_pending_waits == true) {
    psVar1 = (this->m_tracker_timer).impl_.service_;
    boost::asio::detail::epoll_reactor::
    cancel_timer<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>>>
              (psVar1->scheduler_,&psVar1->timer_queue_,
               &(this->m_tracker_timer).impl_.implementation_.timer_data,0xffffffffffffffff);
    (this->m_tracker_timer).impl_.implementation_.might_have_pending_waits = false;
    bVar2 = this->field_0x5c0;
  }
  this->field_0x5c0 = bVar2 & 0xbf;
  now = time_now32();
  tracker_list::stop_announcing(&this->m_trackers,now);
  announce_with_tracker(this,stopped);
  return;
}

Assistant:

void torrent::stop_announcing()
	{
		TORRENT_ASSERT(is_single_thread());
		if (!m_announcing) return;

		m_tracker_timer.cancel();

		m_announcing = false;

		m_trackers.stop_announcing(aux::time_now32());

		announce_with_tracker(event_t::stopped);
	}